

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjCompress2(tjhandle handle,uchar *srcBuf,int width,int pitch,int height,int pixelFormat,
               uchar **jpegBuf,unsigned_long *jpegSize,int jpegSubsamp,int jpegQual,int flags)

{
  int iVar1;
  char *pcVar2;
  jpeg_error_mgr *pjVar3;
  int in_ECX;
  JDIMENSION in_EDX;
  long in_RSI;
  j_compress_ptr in_RDI;
  JDIMENSION in_R8D;
  int in_R9D;
  bool bVar4;
  j_compress_ptr cinfo;
  tjinstance *this;
  JSAMPROW *row_pointer;
  int in_stack_00000020;
  int alloc;
  int retval;
  int i;
  boolean in_stack_ffffffffffffffac;
  j_compress_ptr pjVar5;
  j_compress_ptr cinfo_00;
  int local_30;
  int local_2c;
  int local_20;
  int local_4;
  
  local_30 = 0;
  bVar4 = true;
  cinfo_00 = (j_compress_ptr)0x0;
  if (in_RDI == (j_compress_ptr)0x0) {
    pcVar2 = (char *)__tls_get_addr(&PTR_001e8fc0);
    snprintf(pcVar2,200,"Invalid handle");
    local_4 = -1;
  }
  else {
    *(undefined4 *)&in_RDI[2].fdct = 0;
    *(undefined4 *)(in_RDI[3].ac_huff_tbl_ptrs + 3) = 0;
    *(uint *)((long)&in_RDI[2].fdct + 4) = (uint)((retval & 0x2000U) != 0);
    pjVar5 = in_RDI;
    if (((ulong)in_RDI[2].entropy & 1) == 0) {
      snprintf((char *)&in_RDI[2].script_space,200,"%s",
               "tjCompress2(): Instance has not been initialized for compression");
      *(undefined4 *)(pjVar5[3].ac_huff_tbl_ptrs + 3) = 1;
      pcVar2 = (char *)__tls_get_addr(&PTR_001e8fc0);
      snprintf(pcVar2,200,"%s","tjCompress2(): Instance has not been initialized for compression");
      local_30 = -1;
    }
    else if (((((in_RSI == 0) || ((int)in_EDX < 1)) || (in_ECX < 0)) ||
             (((((int)in_R8D < 1 || (in_R9D < 0)) ||
               ((0xb < in_R9D || ((cinfo == (j_compress_ptr)0x0 || (this == (tjinstance *)0x0))))))
              || ((int)row_pointer < 0)))) ||
            (((5 < (int)row_pointer || (in_stack_00000020 < 0)) || (100 < in_stack_00000020)))) {
      snprintf((char *)&in_RDI[2].script_space,200,"%s","tjCompress2(): Invalid argument");
      *(undefined4 *)(pjVar5[3].ac_huff_tbl_ptrs + 3) = 1;
      pcVar2 = (char *)__tls_get_addr(&PTR_001e8fc0);
      snprintf(pcVar2,200,"%s","tjCompress2(): Invalid argument");
      local_30 = -1;
    }
    else {
      local_20 = in_ECX;
      if (in_ECX == 0) {
        local_20 = in_EDX * tjPixelSize[in_R9D];
      }
      cinfo_00 = (j_compress_ptr)malloc((long)(int)in_R8D << 3);
      if (cinfo_00 == (j_compress_ptr)0x0) {
        snprintf((char *)&pjVar5[2].script_space,200,"%s","tjCompress2(): Memory allocation failure"
                );
        *(undefined4 *)(pjVar5[3].ac_huff_tbl_ptrs + 3) = 1;
        pcVar2 = (char *)__tls_get_addr(&PTR_001e8fc0);
        snprintf(pcVar2,200,"%s","tjCompress2(): Memory allocation failure");
        local_30 = -1;
      }
      else {
        iVar1 = _setjmp((__jmp_buf_tag *)&pjVar5[2].restart_interval);
        if (iVar1 == 0) {
          in_RDI->image_width = in_EDX;
          in_RDI->image_height = in_R8D;
          if ((retval & 8U) == 0) {
            if ((retval & 0x10U) == 0) {
              if ((retval & 0x20U) != 0) {
                putenv("JSIMD_FORCESSE2=1");
              }
            }
            else {
              putenv("JSIMD_FORCESSE=1");
            }
          }
          else {
            putenv("JSIMD_FORCEMMX=1");
          }
          bVar4 = (retval & 0x400U) != 0;
          if (bVar4) {
            pjVar3 = (jpeg_error_mgr *)
                     tjBufSize((int)((ulong)cinfo_00 >> 0x20),(int)cinfo_00,
                               (int)((ulong)pjVar5 >> 0x20));
            (this->cinfo).err = pjVar3;
          }
          bVar4 = !bVar4;
          jpeg_mem_dest_tj(cinfo_00,(uchar **)pjVar5,(unsigned_long *)in_RDI,
                           in_stack_ffffffffffffffac);
          setCompDefaults(cinfo_00,(int)((ulong)pjVar5 >> 0x20),(int)pjVar5,
                          (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
          jpeg_start_compress(in_RDI,in_stack_ffffffffffffffac);
          for (local_2c = 0; local_2c < (int)in_R8D; local_2c = local_2c + 1) {
            if ((retval & 2U) == 0) {
              cinfo_00->quant_tbl_ptrs[(long)local_2c + -0xc] =
                   (JQUANT_TBL *)(in_RSI + (long)local_2c * (long)local_20);
            }
            else {
              cinfo_00->quant_tbl_ptrs[(long)local_2c + -0xc] =
                   (JQUANT_TBL *)(in_RSI + (long)(int)((in_R8D - local_2c) + -1) * (long)local_20);
            }
          }
          while (in_RDI->next_scanline < in_RDI->image_height) {
            jpeg_write_scanlines(cinfo_00,(JSAMPARRAY)pjVar5,(JDIMENSION)((ulong)in_RDI >> 0x20));
          }
          jpeg_finish_compress(in_RDI);
        }
        else {
          local_30 = -1;
        }
      }
    }
    if (100 < in_RDI->global_state) {
      if (bVar4) {
        (*in_RDI->dest->term_destination)(in_RDI);
      }
      jpeg_abort_compress((j_compress_ptr)0x17876a);
    }
    free(cinfo_00);
    if (*(int *)&pjVar5[2].fdct != 0) {
      local_30 = -1;
    }
    *(undefined4 *)((long)&pjVar5[2].fdct + 4) = 0;
    local_4 = local_30;
  }
  return local_4;
}

Assistant:

DLLEXPORT int tjCompress2(tjhandle handle, const unsigned char *srcBuf,
                          int width, int pitch, int height, int pixelFormat,
                          unsigned char **jpegBuf, unsigned long *jpegSize,
                          int jpegSubsamp, int jpegQual, int flags)
{
  int i, retval = 0, alloc = 1;
  JSAMPROW *row_pointer = NULL;

  GET_CINSTANCE(handle)
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;
  if ((this->init & COMPRESS) == 0)
    THROW("tjCompress2(): Instance has not been initialized for compression");

  if (srcBuf == NULL || width <= 0 || pitch < 0 || height <= 0 ||
      pixelFormat < 0 || pixelFormat >= TJ_NUMPF || jpegBuf == NULL ||
      jpegSize == NULL || jpegSubsamp < 0 || jpegSubsamp >= NUMSUBOPT ||
      jpegQual < 0 || jpegQual > 100)
    THROW("tjCompress2(): Invalid argument");

  if (pitch == 0) pitch = width * tjPixelSize[pixelFormat];

  if ((row_pointer = (JSAMPROW *)malloc(sizeof(JSAMPROW) * height)) == NULL)
    THROW("tjCompress2(): Memory allocation failure");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  cinfo->image_width = width;
  cinfo->image_height = height;

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_NOREALLOC) {
    alloc = 0;  *jpegSize = tjBufSize(width, height, jpegSubsamp);
  }
  jpeg_mem_dest_tj(cinfo, jpegBuf, jpegSize, alloc);
  setCompDefaults(cinfo, pixelFormat, jpegSubsamp, jpegQual, flags);

  jpeg_start_compress(cinfo, TRUE);
  for (i = 0; i < height; i++) {
    if (flags & TJFLAG_BOTTOMUP)
      row_pointer[i] = (JSAMPROW)&srcBuf[(height - i - 1) * (size_t)pitch];
    else
      row_pointer[i] = (JSAMPROW)&srcBuf[i * (size_t)pitch];
  }
  while (cinfo->next_scanline < cinfo->image_height)
    jpeg_write_scanlines(cinfo, &row_pointer[cinfo->next_scanline],
                         cinfo->image_height - cinfo->next_scanline);
  jpeg_finish_compress(cinfo);

bailout:
  if (cinfo->global_state > CSTATE_START) {
    if (alloc) (*cinfo->dest->term_destination) (cinfo);
    jpeg_abort_compress(cinfo);
  }
  free(row_pointer);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}